

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O0

stumpless_entry *
new_entry(stumpless_facility facility,stumpless_severity severity,char *app_name,char *msgid,
         char *message,size_t message_length)

{
  stumpless_entry *entry_00;
  stumpless_entry *result;
  stumpless_entry *entry;
  size_t message_length_local;
  char *message_local;
  char *msgid_local;
  char *app_name_local;
  stumpless_severity severity_local;
  stumpless_facility facility_local;
  
  if ((entry_cache == (cache *)0x0) &&
     (entry_cache = cache_new(0x238,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0),
     entry_cache == (cache *)0x0)) {
    _severity_local = (stumpless_entry *)0x0;
  }
  else {
    entry_00 = (stumpless_entry *)cache_alloc(entry_cache);
    if (entry_00 == (stumpless_entry *)0x0) {
      _severity_local = (stumpless_entry *)0x0;
    }
    else {
      clear_error();
      _severity_local =
           unchecked_load_entry(entry_00,facility,severity,app_name,msgid,message,message_length);
      if (_severity_local == (stumpless_entry *)0x0) {
        cache_free(entry_cache,entry_00);
      }
    }
  }
  return _severity_local;
}

Assistant:

struct stumpless_entry *
new_entry( enum stumpless_facility facility,
           enum stumpless_severity severity,
           const char *app_name,
           const char *msgid,
           char *message,
           size_t message_length ) {
  struct stumpless_entry *entry;
  struct stumpless_entry *result;

  if( unlikely( !entry_cache ) ) {
    entry_cache = cache_new( sizeof( *entry ), NULL, NULL );
    if( !entry_cache ) {
      return NULL;
    }
  }

  entry = cache_alloc( entry_cache );
  if( unlikely( !entry ) ) {
    return NULL;
  }

  clear_error(  );

  result = unchecked_load_entry( entry,
                                 facility,
                                 severity,
                                 app_name,
                                 msgid,
                                 message,
                                 message_length );

  if( !result ) {
    cache_free( entry_cache, entry );
  }

  return result;
}